

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O2

void __thiscall ev3dev::nxt_motor::nxt_motor(nxt_motor *this,address_type *address)

{
  allocator local_49;
  motor_type local_48;
  address_type local_28;
  
  std::__cxx11::string::string((string *)&local_28,(string *)address);
  std::__cxx11::string::string((string *)&local_48,motor::motor_nxt,&local_49);
  motor::motor(&this->super_motor,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

nxt_motor::nxt_motor(address_type address)
    : motor(address, motor_nxt)
{ }